

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O0

int mod_inv_restore_acc(model_inventory_t *minv,char *accumdir,int mixw_reest,int mean_reest,
                       int var_reest,int tmat_reest,uint32 *veclen)

{
  int iVar1;
  uint32 *out_n_feat;
  uint32 *out_n_density;
  int32 local_1064;
  uint local_1060;
  int32 pass2var;
  uint32 i;
  int ret;
  uint32 *rd_veclen;
  uint32 n_cb;
  uint32 n_state_pm;
  uint32 n_tmat;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mixw;
  char fn [4097];
  int tmat_reest_local;
  int var_reest_local;
  int mean_reest_local;
  int mixw_reest_local;
  char *accumdir_local;
  model_inventory_t *minv_local;
  
  pass2var = 0;
  unique0x10000426 = tmat_reest;
  if (mixw_reest != 0) {
    ckd_free_3d(minv->mixw_acc);
    minv->mixw_acc = (float32 ***)0x0;
    sprintf((char *)&n_feat,"%s/mixw_counts",accumdir);
    iVar1 = s3mixw_read((char *)&n_feat,&minv->mixw_acc,&n_density,&n_tmat,&n_state_pm);
    if (iVar1 != 0) {
      return -1;
    }
    if (n_density != minv->n_mixw) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1cc,"Checkpointed n_mixw=%u inconsistent w/ trainer config=%u\n",(ulong)n_density,
              (ulong)minv->n_mixw);
      pass2var = -1;
    }
    if (n_tmat != minv->n_feat) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1d1,"Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n",(ulong)n_tmat,
              (ulong)minv->n_feat);
      pass2var = -1;
    }
    if (n_state_pm != minv->n_density) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1d7,"Checkpointed n_density=%u inconsistent w/ trainer config=%u\n",
              (ulong)n_state_pm,(ulong)minv->n_density);
      pass2var = -1;
    }
  }
  if (stack0xffffffffffffffd0 != 0) {
    ckd_free_3d(minv->tmat_acc);
    minv->tmat_acc = (float32 ***)0x0;
    sprintf((char *)&n_feat,"%s/tmat_counts",accumdir);
    iVar1 = s3tmat_read((char *)&n_feat,&minv->tmat_acc,&n_cb,(uint32 *)((long)&rd_veclen + 4));
    if (iVar1 != 0) {
      return -1;
    }
    if (n_cb != minv->n_tmat) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1e9,"Checkpointed n_tmat=%u inconsistent w/ trainer config=%u\n",(ulong)n_cb,
              (ulong)minv->n_tmat);
    }
    if (rd_veclen._4_4_ != minv->n_state_pm) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x1ed,"Checkpointed n_state_pm=%u inconsistent w/ trainer config=%u\n",
              (ulong)rd_veclen._4_4_,(ulong)minv->n_state_pm);
      pass2var = -1;
    }
  }
  if ((mean_reest != 0) || (var_reest != 0)) {
    gauden_free_acc(minv->gauden);
    sprintf((char *)&n_feat,"%s/gauden_counts",accumdir);
    out_n_feat = &n_tmat;
    out_n_density = &n_state_pm;
    iVar1 = s3gaucnt_read((char *)&n_feat,&minv->gauden->macc,&minv->gauden->vacc,&local_1064,
                          &minv->gauden->dnom,(uint32 *)&rd_veclen,out_n_feat,out_n_density,
                          (uint32 **)&i);
    if (iVar1 != 0) {
      return -1;
    }
    if ((uint)rd_veclen != minv->gauden->n_mgau) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x203,"Checkpointed n_cb=%u inconsistent w/ trainer config=%u\n",
              (ulong)(uint)rd_veclen,(ulong)minv->gauden->n_mgau);
      pass2var = -1;
    }
    if (n_tmat != minv->n_feat) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x208,"Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n",(ulong)n_tmat,
              (ulong)minv->n_feat);
      pass2var = -1;
    }
    if (n_state_pm != minv->n_density) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x20d,"Checkpointed n_density=%u inconsistent w/ trainer config=%u\n",
              (ulong)n_state_pm,(ulong)minv->n_density);
      pass2var = -1;
    }
    for (local_1060 = 0; local_1060 < n_tmat; local_1060 = local_1060 + 1) {
      if (veclen[local_1060] != _i[local_1060]) {
        out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),local_1060);
        out_n_density = (uint32 *)CONCAT44((int)((ulong)out_n_density >> 0x20),veclen[local_1060]);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
                ,0x213,"Checkpointed veclen[%u]=%u inconsistent w/ trainer config veclen[%u]=%u\n",
                (ulong)local_1060,(ulong)_i[local_1060],out_n_feat,out_n_density);
        pass2var = -1;
      }
    }
    ckd_free(_i);
  }
  return pass2var;
}

Assistant:

int
mod_inv_restore_acc(model_inventory_t *minv,
		    const char *accumdir,
		    int mixw_reest,
		    int mean_reest,
		    int var_reest,
		    int tmat_reest,
		    const uint32 *veclen)
{
    char fn[MAXPATHLEN+1];
    uint32 n_mixw;
    uint32 n_feat;
    uint32 n_density;

    uint32 n_tmat;
    uint32 n_state_pm;

    uint32 n_cb;
    uint32 *rd_veclen;

    int ret = S3_SUCCESS;

    uint32 i;
    int32 pass2var;
    
    if (mixw_reest) {
	ckd_free_3d((void ***)minv->mixw_acc);
	minv->mixw_acc = NULL;

	sprintf(fn, "%s/mixw_counts", accumdir);
	if (s3mixw_read(fn,
			&minv->mixw_acc,
			&n_mixw,
			&n_feat,
			&n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	if (n_mixw != minv->n_mixw) {
	    E_ERROR("Checkpointed n_mixw=%u inconsistent w/ trainer config=%u\n",
		    n_mixw, minv->n_mixw);
	    ret = S3_ERROR;
	}
	if (n_feat != minv->n_feat) {
	    E_ERROR("Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n",
		    n_feat, minv->n_feat);
	    ret = S3_ERROR;

	}
	if (n_density != minv->n_density) {
	    E_ERROR("Checkpointed n_density=%u inconsistent w/ trainer config=%u\n",
		    n_density, minv->n_density);
	    ret = S3_ERROR;

	}
    }
    if (tmat_reest) {
	ckd_free_3d((void ***)minv->tmat_acc);
	minv->tmat_acc = NULL;

	sprintf(fn, "%s/tmat_counts", accumdir);
	if (s3tmat_read(fn,
			&minv->tmat_acc,
			&n_tmat,
			&n_state_pm) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	if (n_tmat != minv->n_tmat) {
	    E_ERROR("Checkpointed n_tmat=%u inconsistent w/ trainer config=%u\n",
		    n_tmat, minv->n_tmat);
	}
	if (n_state_pm != minv->n_state_pm) {
	    E_ERROR("Checkpointed n_state_pm=%u inconsistent w/ trainer config=%u\n",
		    n_state_pm, minv->n_state_pm);
	    ret = S3_ERROR;
	}
    }
    if (mean_reest || var_reest) {
	gauden_free_acc(minv->gauden);

	sprintf(fn, "%s/gauden_counts", accumdir);

	if (s3gaucnt_read(fn,
			  &(minv->gauden->macc),
			  &(minv->gauden->vacc),
			  &pass2var,
			  &(minv->gauden->dnom),
			  &n_cb,
			  &n_feat,
			  &n_density,
			  &rd_veclen) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	if (n_cb != minv->gauden->n_mgau) {
	    E_ERROR("Checkpointed n_cb=%u inconsistent w/ trainer config=%u\n",
		    n_cb, minv->gauden->n_mgau);
	    ret = S3_ERROR;
	}
	if (n_feat != minv->n_feat) {
	    E_ERROR("Checkpointed n_feat=%u inconsistent w/ trainer config=%u\n",
		    n_feat, minv->n_feat);
	    ret = S3_ERROR;
	}
	if (n_density != minv->n_density) {
	    E_ERROR("Checkpointed n_density=%u inconsistent w/ trainer config=%u\n",
		    n_density, minv->n_density);
	    ret = S3_ERROR;
	}
	for (i = 0; i < n_feat; i++) {
	    if (veclen[i] != rd_veclen[i]) {
		E_ERROR("Checkpointed veclen[%u]=%u inconsistent w/ trainer config veclen[%u]=%u\n",
			i, rd_veclen[i], i, veclen[i]);
		ret = S3_ERROR;
	    }
	}
	ckd_free(rd_veclen);
    }

    return ret;
}